

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O2

int callback(char *filepath,coda_filefilter_status status,char *error,void *userdata)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *__format;
  coda_product *pf;
  coda_cursor local_328;
  
  iVar3 = 0;
  switch(status) {
  case coda_ffs_error:
    __format = "ERROR: %s for %s\n";
    pcVar6 = filepath;
    filepath = error;
    goto LAB_00101458;
  case coda_ffs_could_not_open_file:
    __format = "ERROR: could not open file %s (%s)\n";
    pcVar6 = error;
LAB_00101458:
    iVar3 = 0;
    fprintf(_stderr,__format,filepath,pcVar6);
    break;
  case coda_ffs_could_not_access_directory:
    iVar3 = 0;
    fprintf(_stderr,"ERROR: unable to access directory %s\n",filepath);
    break;
  case coda_ffs_match:
    iVar2 = coda_open(filepath);
    iVar3 = 1;
    if (iVar2 == 0) {
      iVar2 = coda_cursor_set_product(&local_328,0);
      if (iVar2 == 0) {
        if ((node_expr == (coda_expression *)0x0) ||
           (iVar3 = coda_expression_eval_node(node_expr,&local_328), pFVar1 = _stderr, iVar3 == 0))
        {
          iVar3 = eval_expression(&local_328);
          pFVar1 = _stderr;
          if (iVar3 != 0) {
            puVar4 = (undefined4 *)coda_get_errno();
            uVar5 = coda_errno_to_string(*puVar4);
            fprintf(pFVar1,"ERROR: %s for %s\n",uVar5,filepath);
          }
          iVar3 = coda_close(0);
          return (uint)(iVar3 != 0);
        }
        puVar4 = (undefined4 *)coda_get_errno();
        uVar5 = coda_errno_to_string(*puVar4);
        iVar3 = 0;
        fprintf(pFVar1,"ERROR: could not evaluate path expression: %s\n",uVar5);
      }
      coda_close(0);
    }
  }
  return iVar3;
}

Assistant:

int callback(const char *filepath, coda_filefilter_status status, const char *error, void *userdata)
{
    (void)userdata;     /* prevent unused warning */

    if (status == coda_ffs_error)
    {
        fprintf(stderr, "ERROR: %s for %s\n", error, filepath);
    }
    else if (status == coda_ffs_could_not_access_directory)
    {
        fprintf(stderr, "ERROR: unable to access directory %s\n", filepath);
    }
    else if (status == coda_ffs_could_not_open_file)
    {
        fprintf(stderr, "ERROR: could not open file %s (%s)\n", filepath, error);
    }
    if (status == coda_ffs_match)
    {
        return eval_expression_for_file(filepath);
    }

    return 0;
}